

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceModifier.hpp
# Opt level: O3

void __thiscall OpenMD::UniformField::UniformField(UniformField *this,SimInfo *info)

{
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__ForceModifier_00301f40;
  this->initialized = false;
  this->doUniformField = false;
  this->doParticlePot = false;
  (this->EF).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->EF).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->EF).super_Vector<double,_3U>.data_[2] = 0.0;
  this->simParams = info->simParams_;
  return;
}

Assistant:

ForceModifier(SimInfo* info) : info_ {info} {}